

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

bool __thiscall pbrt::Atoi(pbrt *this,string_view str,int *ptr)

{
  int iVar1;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_28,str._M_len,this + str._M_len);
  iVar1 = std::__cxx11::stoi(&local_28,(size_t *)0x0,10);
  *(int *)str._M_str = iVar1;
  std::__cxx11::string::~string((string *)&local_28);
  return true;
}

Assistant:

bool Atoi(std::string_view str, int *ptr) {
    try {
        *ptr = std::stoi(std::string(str.begin(), str.end()));
    } catch (...) {
        return false;
    }
    return true;
}